

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::generateAndConfigureTextureObjects
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,GLuint texture_width,GLuint n_cubemaps
          ,bool should_generate_mutable_textures)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  releaseAndDetachTextureObject(this,this->m_color_texture_id,true);
  releaseAndDetachTextureObject(this,this->m_depth_texture_id,false);
  (**(code **)(lVar2 + 0x6f8))(1,&this->m_color_texture_id);
  (**(code **)(lVar2 + 0x6f8))(1,&this->m_depth_texture_id);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"glGenTextures() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x1e8);
  if ((int)CONCAT71(in_register_00000009,should_generate_mutable_textures) != 0) {
    prepareMutableTextureObject(this,this->m_color_texture_id,texture_width,n_cubemaps,true);
    prepareMutableTextureObject(this,this->m_depth_texture_id,texture_width,n_cubemaps,false);
    return;
  }
  prepareImmutableTextureObject(this,this->m_color_texture_id,texture_width,n_cubemaps,true);
  prepareImmutableTextureObject(this,this->m_depth_texture_id,texture_width,n_cubemaps,false);
  return;
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::generateAndConfigureTextureObjects(
	glw::GLuint texture_width, glw::GLuint n_cubemaps, bool should_generate_mutable_textures)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release any texture objects that may have already been initialized */
	releaseAndDetachTextureObject(m_color_texture_id, true /* is_color_attachment */);
	releaseAndDetachTextureObject(m_depth_texture_id, false /* is_color_attachment */);

	/* Generate texture objects */
	gl.genTextures(1, &m_color_texture_id);
	gl.genTextures(1, &m_depth_texture_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call(s) failed");

	/* Configure new textures' storage */
	if (true == should_generate_mutable_textures)
	{
		prepareMutableTextureObject(m_color_texture_id, texture_width, n_cubemaps,
									true /* should_take_color_texture_properties */);
		prepareMutableTextureObject(m_depth_texture_id, texture_width, n_cubemaps,
									false /* should_take_color_texture_properties */);
	}
	else
	{
		prepareImmutableTextureObject(m_color_texture_id, texture_width, n_cubemaps,
									  true /* should_take_color_texture_properties */);
		prepareImmutableTextureObject(m_depth_texture_id, texture_width, n_cubemaps,
									  false /* should_take_color_texture_properties */);
	}
}